

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_ttf_font_info *
rf_parse_ttf_font(rf_ttf_font_info *__return_storage_ptr__,void *ttf_data,rf_int font_size)

{
  long lVar1;
  int iVar2;
  long *in_FS_OFFSET;
  undefined4 uStack_1ac;
  void *local_190;
  int local_188;
  int local_180;
  int local_17c;
  int local_178;
  int local_174;
  undefined1 local_d0;
  int local_c8;
  int local_c4;
  int line_gap;
  int descent;
  int ascent;
  float scale_factor;
  stbtt_fontinfo font_info;
  rf_int font_size_local;
  void *ttf_data_local;
  
  font_info.fdselect._8_8_ = font_size;
  memset(__return_storage_ptr__,0,200);
  if ((ttf_data != (void *)0x0) && (0 < (long)font_info.fdselect._8_8_)) {
    memset(&ascent,0,0xa0);
    iVar2 = stbtt_InitFont((stbtt_fontinfo *)&ascent,(uchar *)ttf_data,0);
    if (iVar2 == 0) {
      rf_log_impl(8,0x1b311d);
      lVar1 = *in_FS_OFFSET;
      *(char **)(lVar1 + -0x460) =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      *(char **)(lVar1 + -0x458) = "rf_parse_ttf_font";
      *(undefined8 *)(lVar1 + -0x450) = 0x5b6e;
      *(ulong *)(lVar1 + -0x448) = CONCAT44(uStack_1ac,8);
    }
    else {
      descent = (int)stbtt_ScaleForPixelHeight
                               ((stbtt_fontinfo *)&ascent,(float)(long)font_info.fdselect._8_8_);
      stbtt_GetFontVMetrics((stbtt_fontinfo *)&ascent,&line_gap,&local_c4,&local_c8);
      memset(&local_190,0,200);
      local_188 = font_info.fdselect.cursor;
      local_180 = descent;
      local_17c = line_gap;
      local_178 = local_c4;
      local_174 = local_c8;
      local_d0 = 1;
      local_190 = ttf_data;
      memcpy(__return_storage_ptr__,&local_190,200);
      memcpy(&__return_storage_ptr__->internal_stb_font_info,&ascent,0xa0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_ttf_font_info rf_parse_ttf_font(const void* ttf_data, rf_int font_size)
{
    rf_ttf_font_info result = {0};

    if (ttf_data && font_size > 0)
    {
        stbtt_fontinfo font_info = {0};
        if (stbtt_InitFont(&font_info, ttf_data, 0))
        {
            // Calculate font scale factor
            float scale_factor = stbtt_ScaleForPixelHeight(&font_info, (float)font_size);

            // Calculate font basic metrics
            // NOTE: ascent is equivalent to font baseline
            int ascent, descent, line_gap;
            stbtt_GetFontVMetrics(&font_info, &ascent, &descent, &line_gap);

            result = (rf_ttf_font_info)
            {
                .ttf_data = ttf_data,
                .font_size = font_size,
                .scale_factor = scale_factor,
                .ascent = ascent,
                .descent = descent,
                .line_gap = line_gap,
                .valid = true,
            };

            RF_ASSERT(sizeof(stbtt_fontinfo) == sizeof(result.internal_stb_font_info));
            memcpy(&result.internal_stb_font_info, &font_info, sizeof(stbtt_fontinfo));
        }
        else RF_LOG_ERROR(RF_STBTT_FAILED, "STB failed to parse ttf font.");
    }

    return result;
}